

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioType.cpp
# Opt level: O0

bool __thiscall DIS::RadioType::operator==(RadioType *this,RadioType *rhs)

{
  bool local_19;
  bool ivarsEqual;
  RadioType *rhs_local;
  RadioType *this_local;
  
  local_19 = this->_domain == rhs->_domain && this->_entityKind == rhs->_entityKind;
  if (this->_country != rhs->_country) {
    local_19 = false;
  }
  if (this->_category != rhs->_category) {
    local_19 = false;
  }
  if (this->_subcategory != rhs->_subcategory) {
    local_19 = false;
  }
  if (this->_specific != rhs->_specific) {
    local_19 = false;
  }
  if (this->_extra != rhs->_extra) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool RadioType::operator ==(const RadioType& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_entityKind == rhs._entityKind) ) ivarsEqual = false;
     if( ! (_domain == rhs._domain) ) ivarsEqual = false;
     if( ! (_country == rhs._country) ) ivarsEqual = false;
     if( ! (_category == rhs._category) ) ivarsEqual = false;
     if( ! (_subcategory == rhs._subcategory) ) ivarsEqual = false;
     if( ! (_specific == rhs._specific) ) ivarsEqual = false;
     if( ! (_extra == rhs._extra) ) ivarsEqual = false;

    return ivarsEqual;
 }